

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O3

int lj_cdata_get(CTState *cts,CType *s,TValue *o,uint8_t *sp)

{
  long *plVar1;
  int iVar2;
  GCcdata *pGVar3;
  void *pvVar4;
  CTypeID id;
  ulong uVar5;
  CType *s_00;
  uint uVar6;
  bool bVar7;
  double dVar8;
  
  uVar6 = s->info;
  if (uVar6 >> 0x1c == 10) {
    iVar2 = lj_cconv_tv_bf(cts,s,o,sp);
    return iVar2;
  }
  if (uVar6 >> 0x1c == 0xb) {
    dVar8 = (double)s->size;
    if ((*(uint *)((long)&cts->tab->info + (ulong)((uVar6 & 0xffff) << 4)) & 0x800000) == 0) {
      dVar8 = (double)(int)s->size;
    }
    o->n = dVar8;
    return 0;
  }
  id = uVar6 & 0xffff;
  uVar5 = (ulong)(id << 4);
  uVar6 = *(uint *)((long)&cts->tab->info + uVar5);
  if ((uVar6 & 0xf0800000) == 0x20800000) {
    sp = *(uint8_t **)sp;
    id = uVar6 & 0xffff;
    uVar5 = (ulong)(id << 4);
  }
  s_00 = (CType *)((long)&cts->tab->info + uVar5);
  uVar6 = s_00->info;
  if (uVar6 < 0x10000000) {
    if (0x7ffffff < uVar6) {
      if (s_00->size == 1) {
        bVar7 = (char)*(int *)sp == '\0';
      }
      else {
        bVar7 = *(int *)sp == 0;
      }
      (o->field_2).it = -(uint)!bVar7 - 2;
      (cts->g->tmptv2).field_2.it = -(uint)!bVar7 - 2;
      return 0;
    }
    if ((0x3ffffff < uVar6) || (uVar6 = s_00->size, uVar6 < 5)) {
      lj_cconv_ct_ct(cts,cts->tab + 0xe,s_00,(uint8_t *)&o->u64,sp,0);
      return 0;
    }
  }
  else {
    if ((uVar6 & 0xf0000000) == 0x10000000 || (uVar6 & 0xfc000000) == 0x30000000) {
      pGVar3 = lj_cdata_newref(cts,sp,id);
      (o->u32).lo = (uint32_t)pGVar3;
      (o->field_2).it = 0xfffffff5;
      return 1;
    }
    uVar6 = s_00->size;
  }
  iVar2 = *(int *)&cts->tab;
  pvVar4 = lj_mem_newgco(cts->L,uVar6 + 8);
  *(undefined1 *)((long)pvVar4 + 5) = 10;
  *(short *)((long)pvVar4 + 6) = (short)((uint)((int)s_00 - iVar2) >> 4);
  plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
  *plVar1 = *plVar1 + 1;
  (o->u32).lo = (uint32_t)pvVar4;
  (o->field_2).it = 0xfffffff5;
  memcpy((void *)((long)pvVar4 + 8),sp,(ulong)uVar6);
  return 1;
}

Assistant:

int lj_cdata_get(CTState *cts, CType *s, TValue *o, uint8_t *sp)
{
  CTypeID sid;

  if (ctype_isconstval(s->info)) {
    cdata_getconst(cts, o, s);
    return 0;  /* No GC step needed. */
  } else if (ctype_isbitfield(s->info)) {
    return lj_cconv_tv_bf(cts, s, o, sp);
  }

  /* Get child type of pointer/array/field. */
  lj_assertCTS(ctype_ispointer(s->info) || ctype_isfield(s->info),
	       "pointer or field expected");
  sid = ctype_cid(s->info);
  s = ctype_get(cts, sid);

  /* Resolve reference for field. */
  if (ctype_isref(s->info)) {
    lj_assertCTS(s->size == CTSIZE_PTR, "ref is not pointer-sized");
    sp = *(uint8_t **)sp;
    sid = ctype_cid(s->info);
    s = ctype_get(cts, sid);
  }

  /* Skip attributes. */
  while (ctype_isattrib(s->info))
    s = ctype_child(cts, s);

  return lj_cconv_tv_ct(cts, s, sid, o, sp);
}